

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int IDASetLinearSolutionScaling(void *ida_mem,int onoff)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDASetLinearSolutionScaling",&IDA_mem,&idals_mem);
  if (iVar1 == 0) {
    if (idals_mem->matrixbased == 0) {
      iVar1 = -3;
    }
    else {
      idals_mem->scalesol = onoff;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int IDASetLinearSolutionScaling(void* ida_mem, sunbooleantype onoff)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* check for valid solver type */
  if (!(idals_mem->matrixbased)) { return (IDALS_ILL_INPUT); }

  /* set solution scaling flag */
  idals_mem->scalesol = onoff;

  return (IDALS_SUCCESS);
}